

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info_manager.cpp
# Opt level: O0

void spvtools::opt::analysis::anon_unknown_0::SetInlinedOperand
               (Instruction *dbg_inlined_at,uint32_t inlined_operand)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  Instruction *this;
  CommonDebugInfoInstructions CVar1;
  uint32_t uVar2;
  uint32_t local_c4;
  iterator local_c0;
  undefined8 local_b8;
  SmallVector<unsigned_int,_2UL> local_b0;
  uint32_t local_84;
  iterator local_80;
  undefined8 local_78;
  SmallVector<unsigned_int,_2UL> local_70;
  Operand local_48;
  uint32_t local_14;
  Instruction *pIStack_10;
  uint32_t inlined_operand_local;
  Instruction *dbg_inlined_at_local;
  
  local_14 = inlined_operand;
  pIStack_10 = dbg_inlined_at;
  if (dbg_inlined_at == (Instruction *)0x0) {
    __assert_fail("dbg_inlined_at",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/debug_info_manager.cpp"
                  ,0x34,
                  "void spvtools::opt::analysis::(anonymous namespace)::SetInlinedOperand(Instruction *, uint32_t)"
                 );
  }
  CVar1 = opt::Instruction::GetCommonDebugOpcode(dbg_inlined_at);
  if (CVar1 == CommonDebugInfoDebugInlinedAt) {
    uVar2 = opt::Instruction::NumOperands(pIStack_10);
    this = pIStack_10;
    if (uVar2 < 7) {
      local_84 = local_14;
      local_80 = &local_84;
      local_78 = 1;
      init_list_00._M_len = 1;
      init_list_00._M_array = local_80;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_70,init_list_00);
      Operand::Operand(&local_48,SPV_OPERAND_TYPE_ID,&local_70);
      opt::Instruction::AddOperand(this,&local_48);
      Operand::~Operand(&local_48);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_70);
    }
    else {
      local_c4 = local_14;
      local_c0 = &local_c4;
      local_b8 = 1;
      init_list._M_len = 1;
      init_list._M_array = local_c0;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_b0,init_list);
      opt::Instruction::SetOperand(this,6,&local_b0);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_b0);
    }
    return;
  }
  __assert_fail("dbg_inlined_at->GetCommonDebugOpcode() == CommonDebugInfoDebugInlinedAt",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/debug_info_manager.cpp"
                ,0x36,
                "void spvtools::opt::analysis::(anonymous namespace)::SetInlinedOperand(Instruction *, uint32_t)"
               );
}

Assistant:

void SetInlinedOperand(Instruction* dbg_inlined_at, uint32_t inlined_operand) {
  assert(dbg_inlined_at);
  assert(dbg_inlined_at->GetCommonDebugOpcode() ==
         CommonDebugInfoDebugInlinedAt);
  if (dbg_inlined_at->NumOperands() <= kDebugInlinedAtOperandInlinedIndex) {
    dbg_inlined_at->AddOperand(
        {spv_operand_type_t::SPV_OPERAND_TYPE_ID, {inlined_operand}});
  } else {
    dbg_inlined_at->SetOperand(kDebugInlinedAtOperandInlinedIndex,
                               {inlined_operand});
  }
}